

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void check_and_resend(longlong current_time)

{
  pointer ppVar1;
  bool bVar2;
  reference ppVar3;
  reference ppVar4;
  reference ppVar5;
  mapped_type_conflict *pmVar6;
  pointer ppVar7;
  reference ppVar8;
  reference piVar9;
  int local_14c;
  iterator iStack_148;
  int id;
  iterator __end2_1;
  iterator __begin2_1;
  vector<int,_std::allocator<int>_> *__range2_1;
  longlong diff_2;
  pair<const_int,_long_long> msg;
  iterator __end2;
  iterator __begin2;
  map<int,_long_long,_std::less<int>,_std::allocator<std::pair<const_int,_long_long>_>_> *__range2;
  vector<int,_std::allocator<int>_> outdates_received_kept;
  _Self local_e0;
  iterator it;
  int id_message;
  int id_destination;
  longlong diff_1;
  pair<const_std::pair<int,_int>,_std::pair<void_*,_int>_> elem_1;
  _Self local_a8;
  iterator __end1_2;
  iterator __begin1_2;
  map<std::pair<int,_int>,_std::pair<void_*,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<void_*,_int>_>_>_>
  *__range1_2;
  pair<int,_int> key;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range1_1;
  longlong diff;
  pair<const_std::pair<int,_int>,_long_long> elem;
  iterator __end1;
  iterator __begin1;
  map<std::pair<int,_int>,_long_long,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_long_long>_>_>
  *__range1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> outdates_messages;
  longlong current_time_local;
  
  outdates_messages.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)current_time;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&__range1);
  __end1 = std::
           map<std::pair<int,_int>,_long_long,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_long_long>_>_>
           ::begin(&MT);
  elem.second = (longlong)
                std::
                map<std::pair<int,_int>,_long_long,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_long_long>_>_>
                ::end(&MT);
  while( true ) {
    bVar2 = std::operator!=(&__end1,(_Self *)&elem.second);
    if (!bVar2) break;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_long_long>_>::operator*
                       (&__end1);
    diff = *(longlong *)&ppVar3->first;
    elem.first = (pair<int,_int>)ppVar3->second;
    if (5000000 < (long)outdates_messages.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)elem.first) {
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&__range1,
                 (value_type *)&diff);
    }
    std::_Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_long_long>_>::operator++(&__end1);
  }
  __end1_1 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        &__range1);
  key = (pair<int,_int>)
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&__range1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                        *)&key);
    if (!bVar2) break;
    ppVar4 = __gnu_cxx::
             __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
             ::operator*(&__end1_1);
    erase_message_from_maps(*ppVar4);
    __gnu_cxx::
    __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator++(&__end1_1);
  }
  __end1_2 = std::
             map<std::pair<int,_int>,_std::pair<void_*,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<void_*,_int>_>_>_>
             ::begin(&MM);
  local_a8._M_node =
       (_Base_ptr)
       std::
       map<std::pair<int,_int>,_std::pair<void_*,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<void_*,_int>_>_>_>
       ::end(&MM);
  while( true ) {
    bVar2 = std::operator!=(&__end1_2,&local_a8);
    if (!bVar2) break;
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_std::pair<void_*,_int>_>_>
             ::operator*(&__end1_2);
    ppVar1 = outdates_messages.
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    elem_1.second.first = *(void **)&(ppVar5->second).second;
    diff_1 = *(longlong *)&ppVar5->first;
    elem_1.first = (pair<int,_int>)(ppVar5->second).first;
    pmVar6 = std::
             map<std::pair<int,_int>,_long_long,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_long_long>_>_>
             ::operator[](&MST,(key_type *)&diff_1);
    if (1000000 < (long)ppVar1 - *pmVar6) {
      it._M_node._4_4_ = (int)diff_1;
      it._M_node._0_4_ = diff_1._4_4_;
      send_message((int)diff_1,diff_1._4_4_);
      ppVar1 = outdates_messages.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      pmVar6 = std::
               map<std::pair<int,_int>,_long_long,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_long_long>_>_>
               ::operator[](&MST,(key_type *)&diff_1);
      *pmVar6 = (mapped_type_conflict)ppVar1;
    }
    std::_Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_std::pair<void_*,_int>_>_>::
    operator++(&__end1_2);
  }
  local_e0._M_node =
       (_Base_ptr)
       std::
       map<int,_std::map<int,_long_long,_std::less<int>,_std::allocator<std::pair<const_int,_long_long>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_long_long,_std::less<int>,_std::allocator<std::pair<const_int,_long_long>_>_>_>_>_>
       ::begin(&received_messages);
  while( true ) {
    outdates_received_kept.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  map<int,_std::map<int,_long_long,_std::less<int>,_std::allocator<std::pair<const_int,_long_long>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_long_long,_std::less<int>,_std::allocator<std::pair<const_int,_long_long>_>_>_>_>_>
                  ::end(&received_messages);
    bVar2 = std::operator!=(&local_e0,
                            (_Self *)&outdates_received_kept.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage);
    if (!bVar2) break;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&__range2);
    ppVar7 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::map<int,_long_long,_std::less<int>,_std::allocator<std::pair<const_int,_long_long>_>_>_>_>
             ::operator->(&local_e0);
    __end2 = std::
             map<int,_long_long,_std::less<int>,_std::allocator<std::pair<const_int,_long_long>_>_>
             ::begin(&ppVar7->second);
    msg.second = (longlong)
                 std::
                 map<int,_long_long,_std::less<int>,_std::allocator<std::pair<const_int,_long_long>_>_>
                 ::end(&ppVar7->second);
    while( true ) {
      bVar2 = std::operator!=(&__end2,(_Self *)&msg.second);
      if (!bVar2) break;
      ppVar8 = std::_Rb_tree_iterator<std::pair<const_int,_long_long>_>::operator*(&__end2);
      diff_2 = *(longlong *)ppVar8;
      msg._0_8_ = ppVar8->second;
      if (5000000 < (long)outdates_messages.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage - msg._0_8_) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)&__range2,(value_type_conflict *)&diff_2);
      }
      std::_Rb_tree_iterator<std::pair<const_int,_long_long>_>::operator++(&__end2);
    }
    __end2_1 = std::vector<int,_std::allocator<int>_>::begin
                         ((vector<int,_std::allocator<int>_> *)&__range2);
    iStack_148 = std::vector<int,_std::allocator<int>_>::end
                           ((vector<int,_std::allocator<int>_> *)&__range2);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=(&__end2_1,&stack0xfffffffffffffeb8);
      if (!bVar2) break;
      piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2_1);
      local_14c = *piVar9;
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_int,_std::map<int,_long_long,_std::less<int>,_std::allocator<std::pair<const_int,_long_long>_>_>_>_>
               ::operator->(&local_e0);
      std::map<int,_long_long,_std::less<int>,_std::allocator<std::pair<const_int,_long_long>_>_>::
      erase(&ppVar7->second,&local_14c);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2_1);
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&__range2);
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::map<int,_long_long,_std::less<int>,_std::allocator<std::pair<const_int,_long_long>_>_>_>_>
    ::operator++(&local_e0);
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&__range1);
  return;
}

Assistant:

void check_and_resend(long long current_time) {
    std::vector<std::pair<int, int>> outdates_messages;
    for (auto elem : MT) {
        long long diff = current_time - elem.second;
        if (diff > TIME_TO_KEEP) {
            outdates_messages.push_back(elem.first);
        }
    }

    for (auto key : outdates_messages) {
        erase_message_from_maps(key);
    }

    for (auto elem : MM) {
        long long diff = current_time - MST[elem.first];
        if (diff > SENDING_INTERVAL) {
            int id_destination = elem.first.first;
            int id_message = elem.first.second;
            send_message(id_destination, id_message);
            MST[elem.first] = current_time;
        }
    }

    for (auto it = received_messages.begin(); it != received_messages.end(); ++it) {
        std::vector<int> outdates_received_kept;
        for (auto msg : it->second) {
            long long diff = current_time - msg.second;
            if (diff > TIME_KEEP_RECEIVED) {
                outdates_received_kept.push_back(msg.first);
            }
        }
        for (auto id : outdates_received_kept) {
            it->second.erase(id);
        }
    }
}